

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O0

void secp256k1_heap_down(uchar *arr,size_t i,size_t heap_size,size_t stride,
                        _func_int_void_ptr_void_ptr_void_ptr *cmp,void *cmp_data)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  uchar *in_RDI;
  code *in_R8;
  undefined8 in_R9;
  ulong in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  code *in_stack_ffffffffffffff88;
  uchar *in_stack_ffffffffffffff90;
  ulong local_10;
  
  local_10 = in_RSI;
  do {
    while( true ) {
      if (in_RDX >> 1 <= local_10) {
        return;
      }
      sVar2 = secp256k1_heap_child2(0x111467);
      if (sVar2 < in_RDX) break;
LAB_001115b8:
      in_stack_ffffffffffffff80 = in_RDI;
      in_stack_ffffffffffffff88 = in_R8;
      sVar2 = secp256k1_heap_child1(local_10);
      iVar1 = (*in_stack_ffffffffffffff88)
                        (in_stack_ffffffffffffff80 + sVar2 * in_RCX,in_RDI + local_10 * in_RCX,in_R9
                        );
      if (iVar1 < 1) {
        return;
      }
      in_stack_ffffffffffffff78 = local_10;
      secp256k1_heap_child1(local_10);
      secp256k1_heap_swap(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                          (size_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_10 = secp256k1_heap_child1(local_10);
    }
    sVar2 = secp256k1_heap_child2(0x111499);
    sVar3 = secp256k1_heap_child1(local_10);
    iVar1 = (*in_R8)(in_RDI + sVar2 * in_RCX,in_RDI + sVar3 * in_RCX,in_R9);
    if (iVar1 < 0) goto LAB_001115b8;
    sVar2 = secp256k1_heap_child2(0x11151b);
    iVar1 = (*in_R8)(in_RDI + sVar2 * in_RCX,in_RDI + local_10 * in_RCX,in_R9);
    if (iVar1 < 1) {
      return;
    }
    in_stack_ffffffffffffff90 = in_RDI;
    secp256k1_heap_child2(0x111580);
    secp256k1_heap_swap(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                        (size_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_10 = secp256k1_heap_child2(0x1115a4);
  } while( true );
}

Assistant:

static SECP256K1_INLINE void secp256k1_heap_down(unsigned char *arr, size_t i, size_t heap_size, size_t stride,
                            int (*cmp)(const void *, const void *, void *), void *cmp_data) {
    while (i < heap_size/2) {
        VERIFY_CHECK(i <= SIZE_MAX/2 - 1);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size <= SIZE_MAX
         * 2*i <= SIZE_MAX - 2
         */

        VERIFY_CHECK(secp256k1_heap_child1(i) < heap_size);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size
         * 2*i + 1 < heap_size
         * child1(i) < heap_size
         */

        /* Let [x] be notation for the contents at arr[x*stride].
         *
         * If [child1(i)] > [i] and [child2(i)] > [i],
         *   swap [i] with the larger child to ensure the new parent is larger
         *   than both children. When [child1(i)] == [child2(i)], swap [i] with
         *   [child2(i)].
         * Else if [child1(i)] > [i], swap [i] with [child1(i)].
         * Else if [child2(i)] > [i], swap [i] with [child2(i)].
         */
        if (secp256k1_heap_child2(i) < heap_size
                && 0 <= cmp(arr + secp256k1_heap_child2(i)*stride, arr + secp256k1_heap_child1(i)*stride, cmp_data)) {
            if (0 < cmp(arr + secp256k1_heap_child2(i)*stride, arr + i*stride, cmp_data)) {
                secp256k1_heap_swap(arr, i, secp256k1_heap_child2(i), stride);
                i = secp256k1_heap_child2(i);
            } else {
                /* At this point we have [child2(i)] >= [child1(i)] and we have
                 * [child2(i)] <= [i], and thus [child1(i)] <= [i] which means
                 * that the next comparison can be skipped. */
                return;
            }
        } else if (0 < cmp(arr + secp256k1_heap_child1(i)*stride, arr +         i*stride, cmp_data)) {
            secp256k1_heap_swap(arr, i, secp256k1_heap_child1(i), stride);
            i = secp256k1_heap_child1(i);
        } else {
            return;
        }
    }
    /* heap_size/2 <= i
     * heap_size/2 < i + 1
     * heap_size < 2*i + 2
     * heap_size <= 2*i + 1
     * heap_size <= child1(i)
     * Thus child1(i) and child2(i) are now out of bounds and we are at a leaf.
     */
}